

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QEventPoint>::begin(QList<QEventPoint> *this)

{
  QEventPoint *n;
  QArrayDataPointer<QEventPoint> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QEventPoint> *)0x3543d9);
  QArrayDataPointer<QEventPoint>::operator->(in_RDI);
  n = QArrayDataPointer<QEventPoint>::begin((QArrayDataPointer<QEventPoint> *)0x3543ea);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }